

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O3

void event_ctx_release(event_ctx *ctx)

{
  void *ret;
  void *local_10;
  
  if (ctx != (event_ctx *)0x0) {
    if (*(int *)&ctx[0xf].notify != 0) {
      *(undefined4 *)&ctx[0xf].notify = 0;
      *(undefined4 *)&ctx[0xd].notify = 0;
      pthread_cond_signal((pthread_cond_t *)(ctx + 2));
    }
    pthread_join((pthread_t)ctx[0xe].notify,&local_10);
    free(ctx);
    return;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/test/mpp_event_trigger.c"
                ,0xe4,"void event_ctx_release(struct event_ctx *)");
}

Assistant:

void event_ctx_release(struct event_ctx *ctx)
{
    void *ret;
    struct event_ctx_impl *ictx = (struct event_ctx_impl *)ctx;

    assert(ctx != NULL);

    if (ictx->flag) {
        ictx->flag = 0;
        ictx->semval = 0;
        pthread_cond_signal(&ictx->condition);
    }

    pthread_join(ictx->thr, &ret);

    free(ictx);
}